

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_util_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::
BufferUtilTest_test_hex_buffer_with_empty_string_create_an_empty_buffer_Test::TestBody
          (BufferUtilTest_test_hex_buffer_with_empty_string_create_an_empty_buffer_Test *this)

{
  char *message;
  allocator<char> local_75;
  int local_74;
  AssertionResult gtest_ar;
  AssertHelper local_60 [4];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40 [6];
  unsigned_long local_10;
  
  local_74 = 0;
  message = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"",&local_75);
  bidfx_public_api::tools::BufferUtil::HexBuffer((string *)local_40);
  local_10 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"0","BufferUtil::HexBuffer(\"\").ReadableBytes()",&local_74,
             &local_10);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_40);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/buffer_util_test.cpp"
               ,0x18,message);
    testing::internal::AssertHelper::operator=(local_60,(Message *)local_40);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(BufferUtilTest, test_hex_buffer_with_empty_string_create_an_empty_buffer)
{
    ASSERT_EQ(0, BufferUtil::HexBuffer("").ReadableBytes());
}